

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Transform(ON_Mesh *this,ON_Xform *xform)

{
  curvature_style kappa_style;
  ON_MeshCurvatureStats *this_00;
  bool bVar1;
  uint count;
  uint uVar2;
  int Kcount;
  ON_3dPoint *this_01;
  double *pdVar3;
  ON_3fPoint *this_02;
  ON_TextureCoordinates *this_03;
  float *pfVar4;
  ON_SurfaceCurvature *K;
  ON_3fVector *pOVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  bool local_161;
  int local_148;
  int local_144;
  int j;
  int ki;
  ON_SurfaceCurvature *sc;
  double ks;
  double scale;
  double det;
  ON_Xform N_xform;
  int local_98;
  int tccnt;
  int tci;
  bool rc;
  double d;
  undefined1 local_80 [7];
  bool bSyncheddV;
  ON_BoundingBox transformed_bbox;
  ON_BoundingBox bbox;
  bool bIsValid_dV;
  bool bIsValid_fV;
  uint vertex_count;
  ON_Xform *xform_local;
  ON_Mesh *this_local;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  DestroyTree(this,true);
  count = VertexUnsignedCount(this);
  uVar2 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  bVar6 = count == uVar2;
  if (!bVar6) {
    ON_SimpleArray<ON_3fPoint>::SetCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,0);
  }
  uVar2 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
  bVar7 = count == uVar2;
  if (!bVar7) {
    ON_Geometry::BoundingBox((ON_BoundingBox *)&transformed_bbox.m_max.z,&this->super_ON_Geometry);
    memcpy(local_80,&transformed_bbox.m_max.z,0x30);
    ON_BoundingBox::Transform((ON_BoundingBox *)local_80,xform);
    bVar1 = ON_BeyondSinglePrecision((ON_BoundingBox *)&transformed_bbox.m_max.z,(ON_Xform *)0x0);
    if ((bVar1) ||
       (bVar1 = ON_BeyondSinglePrecision((ON_BoundingBox *)local_80,(ON_Xform *)0x0), bVar1)) {
      UpdateDoublePrecisionVertices(this);
      uVar2 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                        (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
      bVar7 = count == uVar2;
    }
  }
  if (!bVar7) {
    ON_SimpleArray<ON_3dPoint>::SetCount(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
  }
  local_161 = false;
  if ((bVar6) && (local_161 = false, bVar7)) {
    local_161 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  }
  if (bVar7) {
    this_01 = ON_SimpleArray<ON_3dPoint>::operator[]
                        (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
    pdVar3 = ON_3dPoint::operator[](this_01,0);
    ON_TransformPointList(3,false,count,3,pdVar3,xform);
  }
  dVar8 = ON_Xform::Determinant(xform,(double *)0x0);
  tccnt._3_1_ = false;
  if (local_161 == false) {
    if (bVar6) {
      this_02 = ON_SimpleArray<ON_3fPoint>::operator[]
                          (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,0);
      pfVar4 = ON_3fPoint::operator[](this_02,0);
      tccnt._3_1_ = ON_TransformPointList(3,false,count,3,pfVar4,xform);
    }
  }
  else {
    UpdateSinglePrecisionVertices(this);
    tccnt._3_1_ = true;
  }
  if (tccnt._3_1_ != false) {
    ON_MappingTag::Transform(&this->m_Ctag,xform);
    ON_MappingTag::Transform(&this->m_Ttag,xform);
    N_xform.m_xform[3][3]._4_4_ = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC);
    for (local_98 = 0; local_98 < N_xform.m_xform[3][3]._4_4_; local_98 = local_98 + 1) {
      this_03 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,local_98);
      ON_MappingTag::Transform(&this_03->m_tag,xform);
    }
  }
  if (((tccnt._3_1_ == false) || (dVar8 != 0.0)) || (NAN(dVar8))) {
    if (tccnt._3_1_ != false) {
      bVar6 = HasVertexNormals(this);
      if (bVar6) {
        ON_Xform::ON_Xform((ON_Xform *)&det);
        dVar9 = ON_Xform::GetSurfaceNormalXform(xform,(ON_Xform *)&det);
        pOVar5 = ON_SimpleArray<ON_3fVector>::operator[]
                           (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,0);
        pfVar4 = ON_3fVector::operator[](pOVar5,0);
        bVar6 = ON_TransformVectorList(3,count,3,pfVar4,(ON_Xform *)&det);
        tccnt._3_1_ = (bool)(-bVar6 & 1);
        if (dVar9 < 0.0) {
          FlipVertexNormals(this);
        }
        UnitizeVertexNormals(this);
      }
      if ((tccnt._3_1_ != false) && (bVar6 = HasFaceNormals(this), bVar6)) {
        ComputeFaceNormals(this);
      }
    }
  }
  else {
    bVar6 = HasVertexNormals(this);
    if (bVar6) {
      ComputeFaceNormals(this);
      ComputeVertexNormals(this);
    }
    else {
      bVar6 = HasFaceNormals(this);
      if (bVar6) {
        ComputeFaceNormals(this);
      }
    }
  }
  if (((tccnt._3_1_ != false) && (bVar6 = HasPrincipalCurvatures(this), bVar6)) &&
     (1.490116119385e-08 < ABS(ABS(dVar8) - 1.0))) {
    dVar9 = xform->m_xform[0][0];
    if ((((dVar9 == 0.0) && (!NAN(dVar9))) || ((dVar8 == 0.0 && (!NAN(dVar8))))) ||
       ((((dVar9 != xform->m_xform[1][1] || (pdVar3 = xform->m_xform[2] + 2, dVar9 != *pdVar3)) ||
         (NAN(dVar9) || NAN(*pdVar3))) ||
        (dVar8 * 1.490116119385e-08 < ABS(-(dVar9 * dVar9) * dVar9 + dVar8))))) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0xbe6,"","ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
      tccnt._3_1_ = false;
    }
    else {
      _j = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
      local_144 = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
      while (local_144 != 0) {
        _j->k1 = (1.0 / dVar9) * _j->k1;
        _j->k2 = (1.0 / dVar9) * _j->k2;
        _j = _j + 1;
        local_144 = local_144 + -1;
      }
      for (local_148 = 0; local_148 < 4; local_148 = local_148 + 1) {
        if (this->m_kstat[local_148] != (ON_MeshCurvatureStats *)0x0) {
          this_00 = this->m_kstat[local_148];
          kappa_style = this->m_kstat[local_148]->m_style;
          Kcount = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
          K = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
          pOVar5 = ON_SimpleArray<ON_3fVector>::Array
                             (&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
          ON_MeshCurvatureStats::Set(this_00,kappa_style,Kcount,K,pOVar5,0.0);
        }
      }
    }
  }
  InvalidateVertexBoundingBox(this);
  InvalidateVertexNormalBoundingBox(this);
  if (ABS(dVar8) <= 2.3283064365386963e-10) {
    DestroyTopology(this);
  }
  return tccnt._3_1_;
}

Assistant:

bool ON_Mesh::Transform( 
       const ON_Xform& xform
       )
{
  // Transform user data before doing sanity checks in case rogue code
  // damages m_V[], m_dV[] or other data members.
  TransformUserData(xform);
	DestroyTree();

  const unsigned int vertex_count = VertexUnsignedCount();

  const bool bIsValid_fV = (vertex_count == m_V.UnsignedCount());
  if (false == bIsValid_fV)
    m_V.SetCount(0);

  bool bIsValid_dV = (vertex_count == m_dV.UnsignedCount());

  // 2 Jan 2020 S. Baer (RH-54464)
  // If the transform is moving the mesh into or out of "beyond single precision",
  // set up double precision vertices in order to get our best possible precision
  // after the transform.
  if (false == bIsValid_dV)
  {
    ON_BoundingBox bbox = BoundingBox();
    ON_BoundingBox transformed_bbox = bbox;
    transformed_bbox.Transform(xform);
    if (ON_BeyondSinglePrecision(bbox, nullptr) || ON_BeyondSinglePrecision(transformed_bbox, nullptr))
    {
      UpdateDoublePrecisionVertices();
      bIsValid_dV = (vertex_count == m_dV.UnsignedCount());
    }
  }


  if (false == bIsValid_dV)
    m_dV.SetCount(0);

  const bool bSyncheddV = bIsValid_fV && bIsValid_dV && HasSynchronizedDoubleAndSinglePrecisionVertices();

  if (bIsValid_dV)
    ON_TransformPointList(3, false, vertex_count, 3, &m_dV[0][0], xform);
  
  double d = xform.Determinant();
  bool rc = false;
  if ( bSyncheddV )
  {
    // transforming the double precision vertices is the 
    // best way to set the floats.
    UpdateSinglePrecisionVertices();
    rc = true;
  }
  else if ( bIsValid_fV )
  {
    rc = ON_TransformPointList( 3, false, vertex_count, 3, &m_V[0][0], xform );
  }

  if ( rc )
  {
    m_Ctag.Transform(xform);
    m_Ttag.Transform(xform);
    int tci, tccnt = m_TC.Count();
    for ( tci = 0; tci < tccnt; tci++ )
    {
      m_TC[tci].m_tag.Transform(xform);
    }
  }

  if ( rc && 0.0 == d )
  {
    // mesh has been squashed to a plane (or worse)
    if ( HasVertexNormals() )
    {
      ComputeFaceNormals();
      ComputeVertexNormals();
    }
    else if ( HasFaceNormals() )
    {
      ComputeFaceNormals();
    }
  }
  else if ( rc )
  {
    if ( HasVertexNormals() ) 
    {
      // See http://www.gignews.com/realtime020100.htm or these
      // references.
      //
      // 1. Hanrahan, Pat, 
      //    "A Survey of Ray-Surface Intersection Algorithms", 
      //     chapter 3 in Andrew Glassner (editor), 
      //     An Introduction to Ray Tracing, 
      //     Academic Press Inc., London, 1989.
      //
      // 2. Turkowski, Ken, 
      //    "Properties of Surface-Normal Transformations", 
      //     in Andrew Glassner (editor), 
      //     Graphics Gems, Academic Press, Inc., 
      //     pp. 539-547, 1990. 
      ON_Xform N_xform;
      const double det = xform.GetSurfaceNormalXform(N_xform);
      rc = ON_TransformVectorList( 3, vertex_count, 3, &m_N[0][0], N_xform )?true:false;
      if ( det < 0.0 )
      {
        FlipVertexNormals();
      }
      UnitizeVertexNormals();
    }

    if ( rc && HasFaceNormals() ) 
    {
      ComputeFaceNormals();
    }
  }

  if ( rc && HasPrincipalCurvatures() ) 
  {
    if ( fabs(fabs(d) - 1.0) > ON_SQRT_EPSILON ) 
    {
      // If it's a uniform scale, handle it, otherwise we can't do it.
      double scale = xform.m_xform[0][0];
      if ( 0.0 != scale && 0.0 != d
           && scale == xform.m_xform[1][1] 
           && scale == xform.m_xform[2][2] 
           && fabs(d - scale*scale*scale) <= d*ON_SQRT_EPSILON )
      {
        // uniform scale
        const double ks = 1.0/scale;
        ON_SurfaceCurvature* sc = m_K.Array();
        int ki = m_K.Count();
        while ( ki-- )
        {
          sc->k1 *= ks;
          sc->k2 *= ks;
          sc++;
        }

        // update curvature stats.
        for ( int j = 0; j < 4; j++ )
        {
          if ( m_kstat[j] )
            m_kstat[j]->Set( m_kstat[j]->m_style,m_K.Count(),m_K.Array(),m_N.Array() );
        }
      }
      else
      {
        ON_ERROR("ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
        rc = false;
      }
    }
  }

  InvalidateVertexBoundingBox();
  InvalidateVertexNormalBoundingBox();
  if ( fabs(d) <= ON_ZERO_TOLERANCE )
    DestroyTopology(); // transform may not be one-to-one on vertices

  return rc;
}